

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O0

short * __thiscall
SoundRenderer::DecodeSample
          (SoundRenderer *this,int outlen,void *coded,int sizebytes,ECodecType ctype)

{
  int iVar1;
  undefined4 extraout_var;
  SoundDecoder *decoder;
  int local_78;
  int srate;
  SampleType type;
  ChannelConfig chans;
  short *samples;
  MemoryReader reader;
  ECodecType ctype_local;
  int sizebytes_local;
  void *coded_local;
  int outlen_local;
  SoundRenderer *this_local;
  long *plVar2;
  
  reader.bufptr._0_4_ = ctype;
  reader.bufptr._4_4_ = sizebytes;
  MemoryReader::MemoryReader((MemoryReader *)&samples,(char *)coded,(long)sizebytes);
  _type = (SoundRenderer *)calloc(1,(long)outlen);
  iVar1 = (*this->_vptr_SoundRenderer[0x21])(this,(MemoryReader *)&samples);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    this_local = _type;
  }
  else {
    (**(code **)*plVar2)(plVar2,(long)&decoder + 4,&srate,&local_78);
    if ((srate == 0) && (local_78 == 1)) {
      (**(code **)(*plVar2 + 8))(plVar2,_type,(long)outlen);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x38))();
      }
      this_local = _type;
    }
    else {
      DPrintf(2,"Sample is not 16-bit mono\n");
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x38))();
      }
      this_local = _type;
    }
  }
  _type = this_local;
  MemoryReader::~MemoryReader((MemoryReader *)&samples);
  return (short *)this_local;
}

Assistant:

short *SoundRenderer::DecodeSample(int outlen, const void *coded, int sizebytes, ECodecType ctype)
{
    MemoryReader reader((const char*)coded, sizebytes);
    short *samples = (short*)calloc(1, outlen);
    ChannelConfig chans;
    SampleType type;
    int srate;

    SoundDecoder *decoder = CreateDecoder(&reader);
    if(!decoder) return samples;

    decoder->getInfo(&srate, &chans, &type);
    if(chans != ChannelConfig_Mono || type != SampleType_Int16)
    {
        DPrintf(DMSG_WARNING, "Sample is not 16-bit mono\n");
        delete decoder;
        return samples;
    }

    decoder->read((char*)samples, outlen);
    delete decoder;
    return samples;
}